

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase359::run(TestCase359 *this)

{
  char *__tagb;
  float fVar1;
  double dVar2;
  bool local_1a;
  bool local_19;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  double f;
  TestCase359 *this_local;
  
  fVar1 = inf();
  if ((fVar1 * 2.0 != fVar1) || (__tagb = (char *)this, NAN(fVar1 * 2.0) || NAN(fVar1))) {
    __tagb = (char *)0x2;
    local_19 = _::Debug::shouldLog(ERROR);
    while (local_19 != false) {
      __tagb = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++"
      ;
      _::Debug::log<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x17b,ERROR,"\"failed: expected \" \"f * 2 == f\"",
                 (char (*) [28])"failed: expected f * 2 == f");
      local_19 = false;
    }
  }
  dVar2 = nan(__tagb);
  if (!NAN(SUB84(dVar2,0))) {
    local_1a = _::Debug::shouldLog(ERROR);
    while (local_1a != false) {
      _::Debug::log<char_const(&)[27]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x17e,ERROR,"\"failed: expected \" \"!(f == f)\"",
                 (char (*) [27])"failed: expected !(f == f)");
      local_1a = false;
    }
  }
  return;
}

Assistant:

TEST(Common, MinMaxValue) {
  EXPECT_EQ(0x7f, int8_t(maxValue));
  EXPECT_EQ(0xffu, uint8_t(maxValue));
  EXPECT_EQ(0x7fff, int16_t(maxValue));
  EXPECT_EQ(0xffffu, uint16_t(maxValue));
  EXPECT_EQ(0x7fffffff, int32_t(maxValue));
  EXPECT_EQ(0xffffffffu, uint32_t(maxValue));
  EXPECT_EQ(0x7fffffffffffffffll, int64_t(maxValue));
  EXPECT_EQ(0xffffffffffffffffull, uint64_t(maxValue));

  EXPECT_EQ(-0x80, int8_t(minValue));
  EXPECT_EQ(0, uint8_t(minValue));
  EXPECT_EQ(-0x8000, int16_t(minValue));
  EXPECT_EQ(0, uint16_t(minValue));
  EXPECT_EQ(-0x80000000, int32_t(minValue));
  EXPECT_EQ(0, uint32_t(minValue));
  EXPECT_EQ(-0x8000000000000000ll, int64_t(minValue));
  EXPECT_EQ(0, uint64_t(minValue));

  double f = inf();
  EXPECT_TRUE(f * 2 == f);

  f = nan();
  EXPECT_FALSE(f == f);

  // `char`'s signedness is platform-specific.
  EXPECT_LE(char(minValue), '\0');
  EXPECT_GE(char(maxValue), '\x7f');
}